

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BothInclusiveBetweenOperator,true>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  long lVar7;
  ulong uVar8;
  uhugeint_t local_a8;
  data_ptr_t local_90;
  SelectionVector *local_88;
  data_ptr_t local_80;
  SelectionVector *local_78;
  data_ptr_t local_70;
  SelectionVector *local_68;
  SelectionVector *local_60;
  uhugeint_t local_58;
  uhugeint_t local_48;
  ulong local_38;
  
  local_68 = adata->sel;
  local_70 = adata->data;
  local_78 = bdata->sel;
  local_80 = bdata->data;
  local_88 = cdata->sel;
  local_90 = cdata->data;
  local_60 = sel;
  local_38 = count;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      lVar7 = 0;
      if (count != 0) {
        uVar8 = 0;
        do {
          uVar5 = uVar8;
          if (local_60->sel_vector != (sel_t *)0x0) {
            uVar5 = (ulong)local_60->sel_vector[uVar8];
          }
          uVar3 = uVar8;
          if (local_68->sel_vector != (sel_t *)0x0) {
            uVar3 = (ulong)local_68->sel_vector[uVar8];
          }
          uVar2 = uVar8;
          if (local_78->sel_vector != (sel_t *)0x0) {
            uVar2 = (ulong)local_78->sel_vector[uVar8];
          }
          uVar4 = uVar8;
          if (local_88->sel_vector != (sel_t *)0x0) {
            uVar4 = (ulong)local_88->sel_vector[uVar8];
          }
          local_a8.lower = *(uint64_t *)(local_70 + uVar3 * 0x10);
          local_a8.upper = *(uint64_t *)((long)(local_70 + uVar3 * 0x10) + 8);
          local_48.lower = *(uint64_t *)(local_80 + uVar2 * 0x10);
          local_48.upper = *(uint64_t *)((long)(local_80 + uVar2 * 0x10) + 8);
          local_58.lower = *(uint64_t *)(local_90 + uVar4 * 0x10);
          local_58.upper = *(uint64_t *)((long)(local_90 + uVar4 * 0x10) + 8);
          bVar1 = uhugeint_t::operator>(&local_48,&local_a8);
          uVar3 = 1;
          if (!bVar1) {
            bVar1 = uhugeint_t::operator>(&local_a8,&local_58);
            uVar3 = (ulong)bVar1;
          }
          false_sel->sel_vector[lVar7] = (sel_t)uVar5;
          lVar7 = lVar7 + uVar3;
          uVar8 = uVar8 + 1;
        } while (count != uVar8);
      }
      return count - lVar7;
    }
    if (count != 0) {
      iVar6 = 0;
      uVar8 = 0;
      do {
        uVar5 = uVar8;
        if (local_60->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)local_60->sel_vector[uVar8];
        }
        uVar3 = uVar8;
        if (local_68->sel_vector != (sel_t *)0x0) {
          uVar3 = (ulong)local_68->sel_vector[uVar8];
        }
        uVar2 = uVar8;
        if (local_78->sel_vector != (sel_t *)0x0) {
          uVar2 = (ulong)local_78->sel_vector[uVar8];
        }
        uVar4 = uVar8;
        if (local_88->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)local_88->sel_vector[uVar8];
        }
        local_a8.lower = *(uint64_t *)(local_70 + uVar3 * 0x10);
        local_a8.upper = *(uint64_t *)((long)(local_70 + uVar3 * 0x10) + 8);
        local_48.lower = *(uint64_t *)(local_80 + uVar2 * 0x10);
        local_48.upper = *(uint64_t *)((long)(local_80 + uVar2 * 0x10) + 8);
        local_58.lower = *(uint64_t *)(local_90 + uVar4 * 0x10);
        local_58.upper = *(uint64_t *)((long)(local_90 + uVar4 * 0x10) + 8);
        bVar1 = uhugeint_t::operator>(&local_48,&local_a8);
        if (bVar1) {
          uVar3 = 0;
        }
        else {
          bVar1 = uhugeint_t::operator>(&local_a8,&local_58);
          uVar3 = (ulong)!bVar1;
        }
        true_sel->sel_vector[iVar6] = (sel_t)uVar5;
        iVar6 = iVar6 + uVar3;
        uVar8 = uVar8 + 1;
      } while (count != uVar8);
      return iVar6;
    }
  }
  else if (count != 0) {
    iVar6 = 0;
    lVar7 = 0;
    uVar8 = 0;
    do {
      uVar5 = uVar8;
      if (local_60->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)local_60->sel_vector[uVar8];
      }
      uVar3 = uVar8;
      if (local_68->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)local_68->sel_vector[uVar8];
      }
      uVar2 = uVar8;
      if (local_78->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)local_78->sel_vector[uVar8];
      }
      uVar4 = uVar8;
      if (local_88->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)local_88->sel_vector[uVar8];
      }
      local_a8.lower = *(uint64_t *)(local_70 + uVar3 * 0x10);
      local_a8.upper = *(uint64_t *)((long)(local_70 + uVar3 * 0x10) + 8);
      local_48.lower = *(uint64_t *)(local_80 + uVar2 * 0x10);
      local_48.upper = *(uint64_t *)((long)(local_80 + uVar2 * 0x10) + 8);
      local_58.lower = *(uint64_t *)(local_90 + uVar4 * 0x10);
      local_58.upper = *(uint64_t *)((long)(local_90 + uVar4 * 0x10) + 8);
      bVar1 = uhugeint_t::operator>(&local_48,&local_a8);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        bVar1 = uhugeint_t::operator>(&local_a8,&local_58);
        bVar1 = !bVar1;
      }
      true_sel->sel_vector[iVar6] = (sel_t)uVar5;
      iVar6 = iVar6 + bVar1;
      false_sel->sel_vector[lVar7] = (sel_t)uVar5;
      lVar7 = lVar7 + (ulong)(bVar1 ^ 1);
      uVar8 = uVar8 + 1;
    } while (local_38 != uVar8);
    return iVar6;
  }
  return 0;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}